

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

void queries::API::GetObjects
               (KEY_ID s,KEY_ID p,
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *results,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *prov)

{
  TYPE_ID s_00;
  undefined1 local_68 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  tripleTemplates;
  Molecule *m;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *prov_local;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *results_local;
  KEY_ID p_local;
  KEY_ID s_local;
  
  tripleTemplates._M_h._M_single_bucket = (__node_base_ptr)Molecules::Get((Molecules *)diplo::M,s);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_68);
  if (tripleTemplates._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    s_00 = KeyManager::GetType(s);
    TemplateManager::GetTemplates
              ((TemplateManager *)diplo::TM,s_00,p,0xffffffff,0,
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)local_68);
    Molecule::GetEntity((Molecule *)tripleTemplates._M_h._M_single_bucket,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)local_68,s,0,results,prov);
  }
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)local_68);
  return;
}

Assistant:

void API::GetObjects(KEY_ID s, KEY_ID p, unordered_set<KEY_ID> &results, unordered_set<KEY_ID> &prov) {
    Molecule *m = diplo::M.Get(s);
    unordered_set<size_t> tripleTemplates;
    if (m) {
        diplo::TM.GetTemplates(diplo::KM.GetType(s), p, -1, 0, &tripleTemplates);
//		unordered_set<KEY_ID> result4Geo;
//		unordered_set<diplo::TripleIDs> prov;
        m->GetEntity(&tripleTemplates,s,0,&results, &prov);
//		results.insert(unordered_multimap<KEY_ID, diplo::TripleIDs>());
//		cout << "city:\t" << diplo::KM.Get(s) << "\t" << diplo::KM.GetType(s);
//		cerr << "\tOK\t" << results.size() << endl;
//		for (unordered_set<KEY_ID>::iterator it = results.begin(); it != results.end(); it++) {
//			cout << "\t\t---> " << diplo::KM.Get(*it) << endl;
//		}
    }
}